

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid,REF_INT node,REF_INT tri,REF_DBL *ideal_location)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  int node_00;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  int node_01;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REF_DBL dn [3];
  REF_DBL dt [3];
  REF_DBL m [6];
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  uVar2 = ref_cell_nodes(ref_grid->cell[3],tri,nodes);
  if (uVar2 == 0) {
    node_01 = -1;
    node_00 = -1;
    if (nodes[0] == node) {
      node_01 = nodes[1];
      node_00 = nodes[2];
    }
    if (nodes[1] == node) {
      node_01 = nodes[2];
      node_00 = nodes[0];
    }
    if (nodes[2] == node) {
      node_01 = nodes[0];
      node_00 = nodes[1];
    }
    if ((node_01 == -1) || (node_00 == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x12d,"ref_smooth_tri_ideal","empty triangle side");
      return 1;
    }
    pRVar1 = ref_node->real;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      ideal_location[lVar4] = (pRVar1[node_01 * 0xf + lVar4] + pRVar1[node_00 * 0xf + lVar4]) * 0.5;
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dn[lVar4] = pRVar1[node * 0xf + lVar4] - ideal_location[lVar4];
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dt[lVar4] = pRVar1[node_00 * 0xf + lVar4] - pRVar1[node_01 * 0xf + lVar4];
    }
    dVar8 = dt[2] * dt[2] + dt[0] * dt[0] + dt[1] * dt[1];
    dVar7 = dt[2] * dn[2] + dt[0] * dn[0] + dt[1] * dn[1];
    dVar10 = dVar8 * 1e+20;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    dVar9 = -dVar7;
    if (dVar7 <= dVar9) {
      dVar7 = dVar9;
    }
    if (dVar10 <= dVar7) {
      printf("projection = %e tangent_length = %e\n");
      return 4;
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dn[lVar4] = dt[lVar4] * (dVar9 / dVar8) + dn[lVar4];
    }
    uVar2 = ref_math_normalize(dn);
    if (uVar2 == 0) {
      uVar2 = ref_node_metric_get_log(ref_node,node_01,log_m0);
      if (uVar2 == 0) {
        uVar2 = ref_node_metric_get_log(ref_node,node_00,log_m1);
        if (uVar2 == 0) {
          uVar2 = ref_node_metric_get_log(ref_node,node,log_m2);
          if (uVar2 == 0) {
            for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
              log_m[lVar4] = (log_m0[lVar4] + log_m1[lVar4] + log_m2[lVar4]) / 3.0;
            }
            uVar2 = ref_matrix_exp_m(log_m,m);
            if (uVar2 == 0) {
              dVar10 = (m[5] * dn[2] + m[2] * dn[0] + dn[1] * m[4]) * dn[2] +
                       (m[2] * dn[2] + m[0] * dn[0] + m[1] * dn[1]) * dn[0] +
                       (m[4] * dn[2] + m[1] * dn[0] + m[3] * dn[1]) * dn[1];
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              dVar7 = dVar10 * 1e+20;
              if (dVar7 <= -dVar7) {
                dVar7 = -dVar7;
              }
              if (dVar7 <= 0.8660254037844386) {
                printf(" length_in_metric = %e, not invertible\n");
                return 4;
              }
              for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
                ideal_location[lVar4] =
                     dn[lVar4] * (0.8660254037844386 / dVar10) + ideal_location[lVar4];
              }
              return 0;
            }
            uVar6 = (ulong)uVar2;
            pcVar5 = "exp avg";
            uVar3 = 0x14a;
          }
          else {
            uVar6 = (ulong)uVar2;
            pcVar5 = "get node log m";
            uVar3 = 0x148;
          }
        }
        else {
          uVar6 = (ulong)uVar2;
          pcVar5 = "get n1 log m";
          uVar3 = 0x147;
        }
      }
      else {
        uVar6 = (ulong)uVar2;
        pcVar5 = "get n0 log m";
        uVar3 = 0x146;
      }
    }
    else {
      uVar6 = (ulong)uVar2;
      pcVar5 = "normalize direction";
      uVar3 = 0x143;
    }
  }
  else {
    uVar6 = (ulong)uVar2;
    pcVar5 = "get tri";
    uVar3 = 0x11e;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar3,
         "ref_smooth_tri_ideal",uVar6,pcVar5);
  return (REF_STATUS)uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid, REF_INT node,
                                        REF_INT tri, REF_DBL *ideal_location) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT n0, n1;
  REF_INT ixyz, i;
  REF_DBL dn[3];
  REF_DBL dt[3];
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_DBL m[6];
  REF_DBL tangent_length, projection, scale, length_in_metric;

  RSS(ref_cell_nodes(ref_grid_tri(ref_grid), tri, nodes), "get tri");
  n0 = REF_EMPTY;
  n1 = REF_EMPTY;
  if (node == nodes[0]) {
    n0 = nodes[1];
    n1 = nodes[2];
  }
  if (node == nodes[1]) {
    n0 = nodes[2];
    n1 = nodes[0];
  }
  if (node == nodes[2]) {
    n0 = nodes[0];
    n1 = nodes[1];
  }
  if (n0 == REF_EMPTY || n1 == REF_EMPTY) THROW("empty triangle side");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = 0.5 * (ref_node_xyz(ref_node, ixyz, n0) +
                                  ref_node_xyz(ref_node, ixyz, n1));
  for (ixyz = 0; ixyz < 3; ixyz++)
    dn[ixyz] = ref_node_xyz(ref_node, ixyz, node) - ideal_location[ixyz];
  for (ixyz = 0; ixyz < 3; ixyz++)
    dt[ixyz] =
        ref_node_xyz(ref_node, ixyz, n1) - ref_node_xyz(ref_node, ixyz, n0);

  tangent_length = ref_math_dot(dt, dt);
  projection = ref_math_dot(dn, dt);

  if (ref_math_divisible(projection, tangent_length)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      dn[ixyz] -= (projection / tangent_length) * dt[ixyz];
  } else {
    printf("projection = %e tangent_length = %e\n", projection, tangent_length);
    return REF_DIV_ZERO;
  }

  RSS(ref_math_normalize(dn), "normalize direction");

  /* averaged metric */
  RSS(ref_node_metric_get_log(ref_node, n0, log_m0), "get n0 log m");
  RSS(ref_node_metric_get_log(ref_node, n1, log_m1), "get n1 log m");
  RSS(ref_node_metric_get_log(ref_node, node, log_m2), "get node log m");
  for (i = 0; i < 6; i++) log_m[i] = (log_m0[i] + log_m1[i] + log_m2[i]) / 3.0;
  RSS(ref_matrix_exp_m(log_m, m), "exp avg");

  length_in_metric = ref_matrix_sqrt_vt_m_v(m, dn);

  scale = 0.5 * sqrt(3.0); /* altitude of equilateral triangle */
  if (ref_math_divisible(scale, length_in_metric)) {
    scale = scale / length_in_metric;
  } else {
    printf(" length_in_metric = %e, not invertible\n", length_in_metric);
    return REF_DIV_ZERO;
  }

  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] += scale * dn[ixyz];

  return REF_SUCCESS;
}